

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

char * wc_error(int value)

{
  char *pcStack_10;
  int value_local;
  
  if (value < 1) {
    value = -value;
  }
  if (value == 1) {
    pcStack_10 = "\'\' occurred at end of string (expected another character)";
  }
  else if (value == 2) {
    pcStack_10 = "expected \']\' to close character class";
  }
  else if (value == 3) {
    pcStack_10 = "character range was not terminated (\']\' just after \'-\')";
  }
  else {
    pcStack_10 = "INTERNAL ERROR: unrecognised wildcard error number";
  }
  return pcStack_10;
}

Assistant:

const char *wc_error(int value)
{
    value = abs(value);
    switch (value) {
      case WC_TRAILINGBACKSLASH:
        return "'\' occurred at end of string (expected another character)";
      case WC_UNCLOSEDCLASS:
        return "expected ']' to close character class";
      case WC_INVALIDRANGE:
        return "character range was not terminated (']' just after '-')";
    }
    return "INTERNAL ERROR: unrecognised wildcard error number";
}